

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)

{
  xmlNodePtr ns;
  xmlNodePtr node;
  int i;
  xmlNodeSetPtr set_local;
  
  if ((set != (xmlNodeSetPtr)0x0) && (1 < set->nodeNr)) {
    for (node._4_4_ = 0; node._4_4_ < set->nodeNr + -1; node._4_4_ = node._4_4_ + 1) {
      ns = set->nodeTab[node._4_4_];
      if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
        xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
      }
    }
    *set->nodeTab = set->nodeTab[set->nodeNr + -1];
    set->nodeNr = 1;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)
{
    int i;
    xmlNodePtr node;

    if ((set == NULL) || (set->nodeNr <= 1))
	return;
    for (i = 0; i < set->nodeNr - 1; i++) {
        node = set->nodeTab[i];
        if ((node != NULL) &&
            (node->type == XML_NAMESPACE_DECL))
            xmlXPathNodeSetFreeNs((xmlNsPtr) node);
    }
    set->nodeTab[0] = set->nodeTab[set->nodeNr-1];
    set->nodeNr = 1;
}